

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

size_t secp256k1_pippenger_bucket_window_inv(int bucket_window)

{
  if (bucket_window - 1U < 0xc) {
    return *(size_t *)(&DAT_0016e730 + (ulong)(bucket_window - 1U) * 8);
  }
  return 0;
}

Assistant:

static size_t secp256k1_pippenger_bucket_window_inv(int bucket_window) {
    switch(bucket_window) {
        case 1: return 1;
        case 2: return 4;
        case 3: return 20;
        case 4: return 57;
        case 5: return 136;
        case 6: return 235;
        case 7: return 1260;
        case 8: return 1260;
        case 9: return 4420;
        case 10: return 7880;
        case 11: return 16050;
        case PIPPENGER_MAX_BUCKET_WINDOW: return SIZE_MAX;
    }
    return 0;
}